

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

int __thiscall
cs_impl::any::holder<std::pair<cs_impl::any,_cs_impl::any>_>::kill
          (holder<std::pair<cs_impl::any,_cs_impl::any>_> *this,__pid_t __pid,int __sig)

{
  undefined8 *puVar1;
  int extraout_EAX;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  
  (**(this->super_baseHolder)._vptr_baseHolder)
            (this,CONCAT44(in_register_00000034,__pid),CONCAT44(in_register_00000014,__sig));
  if ((DAT_002570e8 < 0x40) && (cs::global_thread_counter == 0)) {
    puVar1 = &holder<std::pair<cs_impl::any,cs_impl::any>>::allocator + DAT_002570e8;
    DAT_002570e8 = DAT_002570e8 + 1;
    *puVar1 = this;
    return 0x256ee0;
  }
  operator_delete(this,0x18);
  return extraout_EAX;
}

Assistant:

void kill() override
			{
				allocator.free(this);
			}